

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::email::email(email *this)

{
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffd0;
  void **in_stack_ffffffffffffffd8;
  regex_field *in_stack_ffffffffffffffe0;
  base_widget *in_stack_fffffffffffffff0;
  
  base_widget::base_widget(in_stack_fffffffffffffff0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd8,"^[^@]+@[^@]+$",
             (allocator *)&stack0xffffffffffffffd7);
  regex_field::regex_field
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  *in_RDI = 0x52ca70;
  in_RDI[0x14] = 0x52cb30;
  in_RDI[6] = 0x52cab8;
  booster::hold_ptr<cppcms::widgets::email::_data>::hold_ptr
            ((hold_ptr<cppcms::widgets::email::_data> *)(in_RDI + 0x13));
  return;
}

Assistant:

email::email() : regex_field("^[^@]+@[^@]+$") {}